

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  p_ply_element ptVar1;
  p_ply_property ptVar2;
  int iVar3;
  p_ply_property __s1;
  p_ply_element __s1_00;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (uint)ply->nelements;
  if (0 < (int)uVar4) {
    ptVar1 = ply->element;
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    __s1_00 = ptVar1;
    while (iVar3 = strcmp(__s1_00->name,element_name), iVar3 != 0) {
      __s1_00 = __s1_00 + 1;
      uVar5 = uVar5 - 1;
      if (uVar5 == 0) {
        return 0;
      }
    }
    if ((ptVar1 != (p_ply_element)0x0) && (uVar4 = (uint)__s1_00->nproperties, 0 < (int)uVar4)) {
      ptVar2 = __s1_00->property;
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      __s1 = ptVar2;
      while (iVar3 = strcmp(__s1->name,property_name), iVar3 != 0) {
        __s1 = __s1 + 1;
        uVar5 = uVar5 - 1;
        if (uVar5 == 0) {
          return 0;
        }
      }
      if (ptVar2 != (p_ply_property)0x0) {
        __s1->read_cb = read_cb;
        __s1->pdata = pdata;
        __s1->idata = idata;
        return (long)(int)__s1_00->ninstances;
      }
    }
  }
  return 0;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
                     const char *property_name, p_ply_read_cb read_cb,
                     void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int)element->ninstances;
}